

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O2

wchar_t borg_new_kill(uint r_idx,wchar_t y,wchar_t x)

{
  borg_kill *pbVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  chunk_conflict *c;
  monster_race *pmVar7;
  int16_t iVar8;
  _Bool _Var9;
  uint32_t uVar10;
  loc grid;
  monster *pmVar11;
  char *pcVar12;
  int iVar13;
  borg_kill *pbVar14;
  int iVar15;
  ulong uVar16;
  wchar_t i;
  ulong uVar17;
  int iVar18;
  borg_grid *pbVar19;
  
  pbVar14 = borg_kills + 1;
  uVar17 = 0xffffffffffffffff;
  for (uVar16 = 1; (i = (wchar_t)uVar17, i < L'\0' && ((long)uVar16 < (long)borg_kills_nxt));
      uVar16 = uVar16 + 1) {
    if (pbVar14->r_idx == 0) {
      uVar17 = uVar16;
    }
    uVar17 = uVar17 & 0xffffffff;
    pbVar14 = pbVar14 + 1;
  }
  if (borg_kills_nxt < 0xff && i < L'\0') {
    i = (wchar_t)borg_kills_nxt;
    borg_kills_nxt = borg_kills_nxt + 1;
  }
  if (i < L'\0') {
    borg_note("# Too many monsters");
    uVar10 = Rand_div((int)borg_kills_nxt - 1);
    i = uVar10 + L'\x02';
    borg_delete_kill(i);
  }
  c = cave;
  grid = (loc)loc(x,y);
  pmVar11 = square_monster(c,grid);
  pbVar14 = borg_kills;
  pmVar7 = r_info;
  if (pmVar11 == (monster *)0x0) {
    i = L'\xffffffff';
  }
  else {
    borg_kills_cnt = borg_kills_cnt + 1;
    pbVar1 = borg_kills + i;
    uVar2 = borg_kills[i].r_idx;
    pbVar19 = borg_grids[y];
    borg_kills[i].r_idx = (uint16_t)r_idx;
    pbVar14[i].pos.x = x;
    pbVar14[i].ox = (uint8_t)x;
    pbVar14[i].pos.y = y;
    pbVar14[i].oy = (uint8_t)y;
    pbVar14[i].m_idx = (int16_t)pmVar11->midx;
    pbVar19[x].kill = (uint8_t)i;
    iVar8 = borg_t;
    pbVar14[i].when = borg_t;
    if (borg_morgoth_id == (r_idx & 0xffff)) {
      borg_t_morgoth = iVar8;
    }
    borg_update_kill_new(i);
    borg_update_kill_old(i);
    uVar3 = pbVar1->r_idx;
    pcVar12 = borg_race_name((uint)uVar3);
    pcVar12 = format("# Creating a monster \'%s\' at (%d,%d), HP: %d, Time: %d, Index: %d",pcVar12,
                     (ulong)(uint)(pbVar1->pos).y,(ulong)(uint)(pbVar1->pos).x,
                     (ulong)(uint)(int)pbVar1->power,(ulong)(uint)(int)pbVar1->when,(uint)uVar3);
    borg_note(pcVar12);
    borg_danger_wipe = true;
    if ((int)borg_t < borg.need_see_invis + 5) {
      iVar4 = borg.c.y / 0xb;
      iVar5 = borg.c.x / 0xb;
      iVar15 = iVar4 + -1;
      if (borg.c.y < 0xb) {
        iVar15 = 0;
      }
      iVar6 = iVar5 + -1;
      if (borg.c.x < 0xb) {
        iVar6 = 0;
      }
      iVar18 = 5;
      if (borg.c.x < 0x37) {
        iVar18 = iVar5 + 1;
      }
      iVar13 = 0x11;
      if (borg.c.x < 0xbb) {
        iVar13 = iVar5 + 1;
      }
      borg_fear_region[iVar4][iVar5] = 0;
      borg_fear_region[iVar4][iVar6] = 0;
      borg_fear_region[iVar4][iVar13] = 0;
      borg_fear_region[iVar15][iVar5] = 0;
      borg_fear_region[iVar18][iVar5] = 0;
      borg_fear_region[iVar15][iVar6] = 0;
      borg_fear_region[iVar15][iVar13] = 0;
      borg_fear_region[iVar18][iVar6] = 0;
      borg_fear_region[iVar18][iVar13] = 0;
      pcVar12 = borg_race_name((uint)pbVar1->r_idx);
      pcVar12 = format("# Removing Regional Fear (%d,%d) because of a LOS %s",(ulong)(uint)y,
                       (ulong)(uint)x,pcVar12);
      borg_note(pcVar12);
    }
    if (borg.trait[0x1a] != 0) {
      _Var9 = borg_los((pbVar1->pos).y,(pbVar1->pos).x,borg.c.y,borg.c.x);
      if (_Var9) {
        borg.goal.type = 0;
      }
    }
    pbVar19 = pbVar19 + x;
    _Var9 = flag_has_dbg(pmVar7[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
    if (!_Var9) {
      pbVar19->feat = '\x01';
    }
    _Var9 = flag_has_dbg(pmVar7[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
    if (_Var9) {
      pbVar19->feat = '\x15';
    }
    pmVar7 = r_info;
    uVar17 = (ulong)borg_nasties_num;
    for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
      if (pmVar7[pbVar1->r_idx].d_char == (int)borg_nasties[uVar16]) {
        borg_nasties_count[uVar16] = borg_nasties_count[uVar16] + '\x01';
      }
    }
  }
  return i;
}

Assistant:

static int borg_new_kill(unsigned int r_idx, int y, int x)
{
    int i, n = -1;

    borg_kill           *kill;
    borg_grid           *ag;
    struct monster_race *r_ptr;
    struct monster      *m_ptr;

    /* Look for a "dead" monster */
    for (i = 1; (n < 0) && (i < borg_kills_nxt); i++) {
        /* Skip real entries */
        if (!borg_kills[i].r_idx)
            n = i;
    }

    /* Allocate a new monster */
    if ((n < 0) && (borg_kills_nxt < 255)) {
        /* Acquire the entry, advance */
        n = borg_kills_nxt++;
    }

    /* Hack -- steal an old monster */
    if (n < 0) {
        /* Note */
        borg_note("# Too many monsters");

        /* Hack -- Pick a random monster */
        n = randint1(borg_kills_nxt - 1) + 1;

        /* Kill it */
        borg_delete_kill(n);
    }

    /* it might be that it can't be found */
    m_ptr = square_monster(cave, loc(x, y));
    if (!m_ptr)
        return -1;

    /* Count the monsters */
    borg_kills_cnt++;

    /* Access the monster */
    kill  = &borg_kills[n];
    r_ptr = &r_info[kill->r_idx];
    ag    = &borg_grids[y][x];

    /* Save the race */
    kill->r_idx = r_idx;

    /* Location */
    kill->ox = kill->pos.x = x;
    kill->oy = kill->pos.y = y;

    /* Games Index of the monster */
    kill->m_idx = m_ptr->midx;

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = n;

    /* Timestamp */
    kill->when = borg_t;

    /* Mark the Morgoth time stamp if needed */
    if (kill->r_idx == borg_morgoth_id)
        borg_t_morgoth = borg_t;

    /* Update the monster */
    borg_update_kill_new(n);

    /* Update the monster */
    borg_update_kill_old(n);

    /* Note (r_info[kill->r_idx].name)*/
    borg_note(format(
        "# Creating a monster '%s' at (%d,%d), HP: %d, Time: %d, Index: %d",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x, kill->power,
        kill->when, kill->r_idx));

    /* Recalculate danger */
    borg_danger_wipe = true;

    /* Remove Regional Fear which may have been induced from a non-LOS monster.
     * We assume this newly created monster is the one which induced our
     * Regional Fear.  If it wasn't, then the borg will create new Regional Fear
     * next time the unseen monster attacks.  There is no harm done by clearing
     * these. At most, he may end up resting in an area for 1 turn */
    if (borg_t < borg.need_see_invis + 5) {
        int y0, x0, y1, x1, y2, x2;

        y0 = (borg.c.y / 11);
        x0 = (borg.c.x / 11);

        /* Nearby regions */
        y1 = (y0 > 0) ? (y0 - 1) : 0;
        x1 = (x0 > 0) ? (x0 - 1) : 0;
        y2 = (x0 < 5) ? (x0 + 1) : 5;
        x2 = (x0 < 17) ? (x0 + 1) : 17;

        /* Remove "fear", spread around */
        borg_fear_region[y0][x0] = 0;
        borg_fear_region[y0][x1] = 0;
        borg_fear_region[y0][x2] = 0;
        borg_fear_region[y1][x0] = 0;
        borg_fear_region[y2][x0] = 0;
        borg_fear_region[y1][x1] = 0;
        borg_fear_region[y1][x2] = 0;
        borg_fear_region[y2][x1] = 0;
        borg_fear_region[y2][x2] = 0;
        borg_note(format("# Removing Regional Fear (%d,%d) because of a LOS %s",
            y, x, borg_race_name(kill->r_idx)));
    }

    /* Wipe goals only if I have some light source */
    if (borg.trait[BI_LIGHT]
        && borg_los(kill->pos.y, kill->pos.x, borg.c.y, borg.c.x))
        borg.goal.type = 0;

    /* Hack -- Force the monster to be sitting on a floor
     * grid unless that monster can pass through walls
     */
    if (!(rf_has(r_ptr->flags, RF_PASS_WALL))) {
        ag->feat = FEAT_FLOOR;
    }

    /* Hack -- Force the ghostly monster to be in a wall
     * grid until the grid is proven to be something else
     */
    if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
        ag->feat = FEAT_GRANITE;
    }

    /* Count up out list of Nasties */
    for (i = 0; i < borg_nasties_num; i++) {
        /* Count them up */
        if (r_info[kill->r_idx].d_char == borg_nasties[i])
            borg_nasties_count[i]++;
    }

    /* Return the monster */
    return n;
}